

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSGlue::emitPreES6(Wasm2JSGlue *this)

{
  pointer puVar1;
  _Head_base<0UL,_wasm::Global_*,_false> _Var2;
  pointer puVar3;
  _Head_base<0UL,_wasm::Table_*,_false> _Var4;
  pointer puVar5;
  _Head_base<0UL,_wasm::Function_*,_false> _Var6;
  bool bVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *pcVar8;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  Name module;
  Name module_00;
  IString name;
  undefined1 local_138 [8];
  ImportInfo imports;
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  baseModuleMap;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  anon_class_24_3_09f8b868 noteImport;
  
  imports.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&baseModuleMap._M_h._M_rehash_policy._M_next_resize;
  baseModuleMap._M_h._M_buckets = (__buckets_ptr)0x1;
  baseModuleMap._M_h._M_bucket_count = 0;
  baseModuleMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  baseModuleMap._M_h._M_element_count._0_4_ = 0x3f800000;
  baseModuleMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  baseModuleMap._M_h._M_rehash_policy._4_4_ = 0;
  baseModuleMap._M_h._M_rehash_policy._M_next_resize = 0;
  baseModuleMap._M_h._M_single_bucket =
       (__node_base_ptr)&seenModules._M_h._M_rehash_policy._M_next_resize;
  seenModules._M_h._M_buckets = (__buckets_ptr)0x1;
  seenModules._M_h._M_bucket_count = 0;
  seenModules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seenModules._M_h._M_element_count._0_4_ = 0x3f800000;
  seenModules._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seenModules._M_h._M_rehash_policy._4_4_ = 0;
  seenModules._M_h._M_rehash_policy._M_next_resize = 0;
  seenModules._M_h._M_single_bucket =
       (__node_base_ptr)
       &imports.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  ImportInfo::ImportInfo((ImportInfo *)local_138,this->wasm);
  puVar1 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar8 = extraout_RDX;
  for (puVar9 = (this->wasm->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    _Var2._M_head_impl =
         (puVar9->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    pcVar8 = *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20);
    if (pcVar8 != (char *)0x0) {
      module.super_IString.str._M_str = pcVar8;
      module.super_IString.str._M_len =
           *(size_t *)
            &((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x18))->super_IString;
      emitPreES6::anon_class_24_3_09f8b868::operator()
                ((anon_class_24_3_09f8b868 *)&seenModules._M_h._M_single_bucket,module,
                 (Name)(((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x28))->
                       super_IString).str);
      pcVar8 = extraout_RDX_00;
    }
  }
  puVar3 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (this->wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3; puVar10 = puVar10 + 1
      ) {
    _Var4._M_head_impl =
         (puVar10->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    pcVar8 = *(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20);
    if (pcVar8 != (char *)0x0) {
      module_00.super_IString.str._M_str = pcVar8;
      module_00.super_IString.str._M_len =
           *(size_t *)
            &((Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x18))->super_IString;
      emitPreES6::anon_class_24_3_09f8b868::operator()
                ((anon_class_24_3_09f8b868 *)&seenModules._M_h._M_single_bucket,module_00,
                 (Name)(((Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x28))->
                       super_IString).str);
      pcVar8 = extraout_RDX_01;
    }
  }
  puVar5 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar11 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar5; puVar11 = puVar11 + 1
      ) {
    _Var6._M_head_impl =
         (puVar11->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var6._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      name.str._M_str = pcVar8;
      name.str._M_len = (size_t)*(char **)((long)&(_Var6._M_head_impl)->super_Importable + 0x30);
      bVar7 = ABI::wasm2js::isHelper
                        (*(wasm2js **)
                          &((Name *)((long)&(_Var6._M_head_impl)->super_Importable + 0x28))->
                           super_IString,name);
      pcVar8 = extraout_RDX_02;
      if (!bVar7) {
        emitPreES6::anon_class_24_3_09f8b868::operator()
                  ((anon_class_24_3_09f8b868 *)&seenModules._M_h._M_single_bucket,
                   (Name)(((Name *)((long)&(_Var6._M_head_impl)->super_Importable + 0x18))->
                         super_IString).str,
                   (Name)(((Name *)((long)&(_Var6._M_head_impl)->super_Importable + 0x28))->
                         super_IString).str);
        pcVar8 = extraout_RDX_03;
      }
    }
  }
  std::operator<<(&this->out->out,'\n');
  ImportInfo::~ImportInfo((ImportInfo *)local_138);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&baseModuleMap._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&imports.importedTags.
                    super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Wasm2JSGlue::emitPreES6() {
  std::unordered_map<Name, Name> baseModuleMap;
  std::unordered_set<Name> seenModules;

  auto noteImport = [&](Name module, Name base) {
    // Right now codegen requires a flat namespace going into the module,
    // meaning we don't support importing the same name from multiple namespaces
    // yet.
    if (baseModuleMap.count(base) && baseModuleMap[base] != module) {
      Fatal() << "the name " << base << " cannot be imported from "
              << "two different modules yet";
    }
    baseModuleMap[base] = module;
    if (seenModules.count(module) == 0) {
      out << "import * as " << asmangle(module.toString()) << " from '"
          << module << "';\n";
      seenModules.insert(module);
    }
  };

  ImportInfo imports(wasm);

  ModuleUtils::iterImportedGlobals(
    wasm, [&](Global* import) { noteImport(import->module, import->base); });
  ModuleUtils::iterImportedTables(
    wasm, [&](Table* import) { noteImport(import->module, import->base); });
  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    noteImport(import->module, import->base);
  });

  out << '\n';
}